

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::half> *value)

{
  bool bVar1;
  half local_24 [2];
  half v;
  optional<tinyusdz::value::half> *poStack_20;
  optional<tinyusdz::value::half> *value_local;
  AsciiParser *this_local;
  
  poStack_20 = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::half>::operator=(poStack_20);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,local_24);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::half>::operator=(poStack_20,local_24);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}